

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  Emulator emu;
  allocator local_59;
  string local_58;
  Emulator local_38;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"USAGE: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1211b0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," filename.nes",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_58,argv[1],&local_59);
    Emulator::Emulator(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    iVar1 = Emulator::run(&local_38);
    Emulator::~Emulator(&local_38);
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
#ifndef __EMSCRIPTEN__
    if (argc < 2) {
        std::cout << "USAGE: " << argv[0] << " filename.nes" << std::endl;
        return 1;
    }
    Emulator emu(argv[1]);
#else
    Emulator emu("game.nes");
#endif
    int ret = emu.run();
    return ret;
}